

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setsvarchecked(ident *id,char *val)

{
  char *pcVar1;
  char *val_local;
  ident *id_local;
  
  if ((id->flags & 8U) == 0) {
    if (((identflags & 0x10U) == 0) && ((id->flags & 2U) == 0)) {
      if ((id->flags & 0x10U) != 0) {
        if ((id->field_5).stack != (identstack *)0x0) {
          operator_delete__((id->field_5).stack);
        }
        id->flags = id->flags & 0xffffffef;
      }
      if (*(void **)(id->field_4).args != (void *)0x0) {
        operator_delete__(*(void **)(id->field_4).args);
      }
    }
    else {
      if ((id->flags & 1U) != 0) {
        debugcode("cannot override persistent variable %s",id->name);
        return;
      }
      if ((id->flags & 0x10U) == 0) {
        id->field_5 = *(anon_union_8_3_5b305ad5_for_ident_8 *)(id->field_4).args;
        id->flags = id->flags | 0x10;
      }
      else if (*(void **)(id->field_4).args != (void *)0x0) {
        operator_delete__(*(void **)(id->field_4).args);
      }
    }
    pcVar1 = newstring(val);
    *(char **)(id->field_4).args = pcVar1;
    ident::changed(id);
  }
  else {
    debugcode("variable %s is read-only",id->name);
  }
  return;
}

Assistant:

void setsvarchecked(ident *id, const char *val)
{
    if(id->flags&IDF_READONLY) debugcode("variable %s is read-only", id->name);
else
    {
        OVERRIDEVAR(return, id->overrideval.s = *id->storage.s, delete[] id->overrideval.s, delete[] *id->storage.s);
        *id->storage.s = newstring(val);
        id->changed();
    }
}